

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O1

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeCornerScaledAngles
          (IntrinsicGeometryInterface *this)

{
  SurfaceMesh *pSVar1;
  size_t sVar2;
  pointer puVar3;
  bool bVar4;
  size_t sVar5;
  size_t sVar6;
  MeshData<geometrycentral::surface::Corner,_double> local_60;
  
  if ((this->cornerAnglesQ).super_DependentQuantity.computed == false) {
    if ((this->cornerAnglesQ).super_DependentQuantity.evaluateFunc.super__Function_base._M_manager
        == (_Manager_type)0x0) goto LAB_00184ed1;
    (*(this->cornerAnglesQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->cornerAnglesQ).super_DependentQuantity.evaluateFunc);
    (this->cornerAnglesQ).super_DependentQuantity.computed = true;
  }
  if ((this->vertexAngleSumsQ).super_DependentQuantity.computed == false) {
    if ((this->vertexAngleSumsQ).super_DependentQuantity.evaluateFunc.super__Function_base.
        _M_manager == (_Manager_type)0x0) {
LAB_00184ed1:
      ::std::__throw_bad_function_call();
    }
    (*(this->vertexAngleSumsQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->vertexAngleSumsQ).super_DependentQuantity.evaluateFunc);
    (this->vertexAngleSumsQ).super_DependentQuantity.computed = true;
  }
  MeshData<geometrycentral::surface::Corner,_double>::MeshData
            (&local_60,(this->super_BaseGeometryInterface).mesh);
  MeshData<geometrycentral::surface::Corner,_double>::operator=(&this->cornerScaledAngles,&local_60)
  ;
  MeshData<geometrycentral::surface::Corner,_double>::~MeshData(&local_60);
  pSVar1 = (this->super_BaseGeometryInterface).mesh;
  sVar2 = pSVar1->nHalfedgesFillCount;
  if ((sVar2 == 0) ||
     ((puVar3 = (pSVar1->heNextArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start, *puVar3 != 0xffffffffffffffff &&
      (*(pSVar1->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start < pSVar1->nFacesFillCount)))) {
    sVar6 = 0;
  }
  else {
    sVar5 = 1;
    sVar6 = sVar5;
    if (sVar2 != 1) {
      do {
        if ((puVar3[sVar5] != 0xffffffffffffffff) &&
           (sVar6 = sVar5,
           (pSVar1->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[sVar5] < pSVar1->nFacesFillCount)) break;
        sVar5 = sVar5 + 1;
        sVar6 = sVar2;
      } while (sVar2 != sVar5);
    }
  }
  if (sVar6 != sVar2) {
    do {
      local_60.defaultValue =
           (double)(pSVar1->heVertexArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar6];
      local_60.mesh = pSVar1;
      bVar4 = Vertex::isBoundary((Vertex *)&local_60);
      (this->cornerScaledAngles).data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_storage.m_data[sVar6] =
           ((double)((ulong)bVar4 * 0x400921fb54442d18 + (ulong)!bVar4 * 0x401921fb54442d18) /
           (this->vertexAngleSums).data.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
           [(pSVar1->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[sVar6]]) *
           (this->cornerAngles).data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data[sVar6];
      sVar5 = sVar6 + 1;
      sVar6 = sVar5;
      if (sVar5 != sVar2) {
        do {
          if (((pSVar1->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start[sVar5] != 0xffffffffffffffff) &&
             (sVar6 = sVar5,
             (pSVar1->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[sVar5] < pSVar1->nFacesFillCount)) break;
          sVar5 = sVar5 + 1;
          sVar6 = sVar2;
        } while (sVar2 != sVar5);
      }
    } while (sVar6 != sVar2);
  }
  return;
}

Assistant:

void IntrinsicGeometryInterface::computeCornerScaledAngles() {
  cornerAnglesQ.ensureHave();
  vertexAngleSumsQ.ensureHave();

  cornerScaledAngles = CornerData<double>(mesh);

  for (Corner c : mesh.corners()) {
    if (c.vertex().isBoundary()) {
      double s = PI / vertexAngleSums[c.vertex()];
      cornerScaledAngles[c] = s * cornerAngles[c];
    } else {
      double s = 2.0 * PI / vertexAngleSums[c.vertex()];
      cornerScaledAngles[c] = s * cornerAngles[c];
    }
  }
}